

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bc7enc.c
# Opt level: O2

void compute_least_squares_endpoints_rgb
               (uint32_t N,uint8_t *pSelectors,vec4F *pSelector_weights,vec4F *pXl,vec4F *pXh,
               color_quad_u8 *pColors)

{
  byte bVar1;
  long lVar2;
  uint uVar3;
  ulong uVar4;
  uint32_t i;
  uint32_t hi_v;
  uint uVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  
  fVar13 = 0.0;
  fVar14 = 0.0;
  fVar11 = 0.0;
  fVar9 = 0.0;
  fVar10 = 0.0;
  fVar6 = 0.0;
  fVar7 = 0.0;
  fVar12 = 0.0;
  fVar8 = 0.0;
  for (uVar4 = 0; N != uVar4; uVar4 = uVar4 + 1) {
    bVar1 = pSelectors[uVar4];
    fVar13 = fVar13 + (float)*(undefined8 *)pSelector_weights[bVar1].m_c;
    fVar14 = fVar14 + (float)((ulong)*(undefined8 *)pSelector_weights[bVar1].m_c >> 0x20);
    fVar8 = fVar8 + pSelector_weights[bVar1].m_c[2];
    fVar15 = pSelector_weights[bVar1].m_c[3];
    fVar12 = fVar12 + fVar15 * (float)pColors[uVar4].m_c[0];
    fVar11 = fVar11 + (float)pColors[uVar4].m_c[0];
    fVar9 = fVar9 + fVar15 * (float)pColors[uVar4].m_c[1];
    fVar10 = fVar10 + (float)pColors[uVar4].m_c[1];
    fVar6 = fVar6 + fVar15 * (float)pColors[uVar4].m_c[2];
    fVar7 = fVar7 + (float)pColors[uVar4].m_c[2];
  }
  fVar15 = fVar13 * fVar8 - fVar14 * fVar14;
  fVar15 = (float)(~-(uint)(fVar15 != 0.0) & (uint)fVar15 |
                  (uint)(1.0 / fVar15) & -(uint)(fVar15 != 0.0));
  fVar8 = fVar8 * fVar15;
  fVar14 = -fVar14 * fVar15;
  fVar15 = fVar15 * fVar13;
  pXl->m_c[0] = fVar8 * fVar12 + (fVar11 - fVar12) * fVar14;
  pXh->m_c[0] = fVar12 * fVar14 + (fVar11 - fVar12) * fVar15;
  pXl->m_c[1] = fVar8 * fVar9 + (fVar10 - fVar9) * fVar14;
  pXh->m_c[1] = fVar9 * fVar14 + (fVar10 - fVar9) * fVar15;
  pXl->m_c[2] = fVar8 * fVar6 + (fVar7 - fVar6) * fVar14;
  pXh->m_c[2] = fVar14 * fVar6 + fVar15 * (fVar7 - fVar6);
  pXl->m_c[3] = 255.0;
  pXh->m_c[3] = 255.0;
  for (lVar2 = 0; lVar2 != 3; lVar2 = lVar2 + 1) {
    if ((pXl->m_c[lVar2] <= 0.0 && pXl->m_c[lVar2] != 0.0) || (255.0 < pXh->m_c[lVar2])) {
      uVar3 = 0xffffffff;
      uVar5 = 0;
      for (uVar4 = 0; N != uVar4; uVar4 = uVar4 + 1) {
        bVar1 = *(uint8_t *)((long)pColors + uVar4 * 4);
        if (bVar1 <= uVar3) {
          uVar3 = (uint)bVar1;
        }
        if (uVar5 <= bVar1) {
          uVar5 = (uint)bVar1;
        }
      }
      if (uVar3 == uVar5) {
        pXl->m_c[lVar2] = (float)(int)uVar3;
        pXh->m_c[lVar2] = (float)(int)uVar3;
      }
    }
    pColors = (color_quad_u8 *)((long)pColors + 1);
  }
  return;
}

Assistant:

static void compute_least_squares_endpoints_rgb(uint32_t N, const uint8_t *pSelectors, const vec4F *pSelector_weights, vec4F *pXl, vec4F *pXh, const color_quad_u8 *pColors)
{
	float z00 = 0.0f, z01 = 0.0f, z10 = 0.0f, z11 = 0.0f;
	float q00_r = 0.0f, q10_r = 0.0f, t_r = 0.0f;
	float q00_g = 0.0f, q10_g = 0.0f, t_g = 0.0f;
	float q00_b = 0.0f, q10_b = 0.0f, t_b = 0.0f;
	for (uint32_t i = 0; i < N; i++)
	{
		const uint32_t sel = pSelectors[i];
		z00 += pSelector_weights[sel].m_c[0];
		z10 += pSelector_weights[sel].m_c[1];
		z11 += pSelector_weights[sel].m_c[2];
		float w = pSelector_weights[sel].m_c[3];
		q00_r += w * pColors[i].m_c[0]; t_r += pColors[i].m_c[0];
		q00_g += w * pColors[i].m_c[1]; t_g += pColors[i].m_c[1];
		q00_b += w * pColors[i].m_c[2]; t_b += pColors[i].m_c[2];
	}

	q10_r = t_r - q00_r;
	q10_g = t_g - q00_g;
	q10_b = t_b - q00_b;

	z01 = z10;

	float det = z00 * z11 - z01 * z10;
	if (det != 0.0f)
		det = 1.0f / det;

	float iz00, iz01, iz10, iz11;
	iz00 = z11 * det;
	iz01 = -z01 * det;
	iz10 = -z10 * det;
	iz11 = z00 * det;

	pXl->m_c[0] = (float)(iz00 * q00_r + iz01 * q10_r); pXh->m_c[0] = (float)(iz10 * q00_r + iz11 * q10_r);
	pXl->m_c[1] = (float)(iz00 * q00_g + iz01 * q10_g); pXh->m_c[1] = (float)(iz10 * q00_g + iz11 * q10_g);
	pXl->m_c[2] = (float)(iz00 * q00_b + iz01 * q10_b); pXh->m_c[2] = (float)(iz10 * q00_b + iz11 * q10_b);
	pXl->m_c[3] = 255.0f; pXh->m_c[3] = 255.0f;

	for (uint32_t c = 0; c < 3; c++)
	{
		if ((pXl->m_c[c] < 0.0f) || (pXh->m_c[c] > 255.0f))
		{
			uint32_t lo_v = UINT32_MAX, hi_v = 0;
			for (uint32_t i = 0; i < N; i++)
			{
				lo_v = minimumu(lo_v, pColors[i].m_c[c]);
				hi_v = maximumu(hi_v, pColors[i].m_c[c]);
			}

			if (lo_v == hi_v)
			{
				pXl->m_c[c] = (float)lo_v;
				pXh->m_c[c] = (float)hi_v;
			}
		}
	}
}